

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_error.hpp
# Opt level: O2

void __thiscall tao::pegtl::parse_error::parse_error(parse_error *this,string *msg,position *pos)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  to_string_abi_cxx11_(&local_40,(pegtl *)pos,pos);
  std::operator+(&local_80,&local_40,": ");
  std::operator+(&local_60,&local_80,msg);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__parse_error_00170bf8;
  (this->positions).super__Vector_base<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positions).super__Vector_base<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->positions).super__Vector_base<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>::
  emplace_back<tao::pegtl::position>(&this->positions,pos);
  return;
}

Assistant:

parse_error( const std::string& msg, position&& pos )
            : std::runtime_error( to_string( pos ) + ": " + msg ),
              positions()
         {
            positions.emplace_back( std::move( pos ) );
         }